

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_update.c
# Opt level: O0

lu_int basiclu_update(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                     lu_int *Wi,double *Wx,double xtbl)

{
  long in_RCX;
  long in_RDX;
  double *in_RSI;
  lu_int *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  lu_int status;
  lu this;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  lu_int status_00;
  double *in_stack_fffffffffffffd08;
  lu_int *in_stack_fffffffffffffd10;
  double *in_stack_fffffffffffffd18;
  lu_int *in_stack_fffffffffffffd20;
  lu *in_stack_fffffffffffffd28;
  double *in_stack_fffffffffffffd40;
  lu_int *in_stack_fffffffffffffd48;
  double *in_stack_fffffffffffffd50;
  int local_294;
  int local_174;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  lu *in_stack_fffffffffffffe98;
  lu_int local_4;
  
  local_4 = lu_load(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                    in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                    (lu_int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                    in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,in_stack_fffffffffffffd50);
  if (local_4 == 0) {
    if (((((in_RDX == 0) || (in_RCX == 0)) || (in_R8 == 0)) ||
        ((in_R9 == 0 || (in_stack_00000008 == 0)))) || (in_stack_00000010 == 0)) {
      status_00 = -3;
    }
    else if (((local_294 < 0) || (local_174 < 0)) || (in_stack_fffffffffffffe90 < 0)) {
      status_00 = -2;
    }
    else {
      status_00 = lu_update(in_stack_fffffffffffffe98,
                            (double)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
    local_4 = lu_save(&stack0xfffffffffffffd08,in_RDI,in_RSI,status_00);
  }
  return local_4;
}

Assistant:

lu_int basiclu_update
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    double xtbl
)
{
    struct lu this;
    lu_int status;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0 || this.ftran_for_update < 0 ||
             this.btran_for_update < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else
    {
        status = lu_update(&this, xtbl);
    }
    return lu_save(&this, istore, xstore, status);
}